

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load-balance-sampling.hpp
# Opt level: O3

void diy::detail::recv_block(AuxBlock *param_1,ProxyWithLink *cp,Master *master)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  _Rb_tree_node_base *p_Var3;
  mapped_type *pmVar4;
  void *b;
  Link *l;
  ulong uVar5;
  IncomingQueues *this;
  vector<int,_std::allocator<int>_> incoming_gids;
  int move_gid;
  int *local_d8;
  iterator iStack_d0;
  int *local_c8;
  int local_bc;
  Master *local_b8;
  function<void_(void_*,_diy::BinaryBuffer_&)> *local_b0;
  function<void_*()> *local_a8;
  _Any_data local_a0;
  code *local_90;
  code *local_88;
  void *local_80;
  undefined **local_78 [2];
  Vector VStack_68;
  undefined8 local_50;
  vector<diy::BinaryBlob,_std::allocator<diy::BinaryBlob>_> vStack_48;
  
  local_d8 = (int *)0x0;
  iStack_d0._M_current = (int *)0x0;
  local_c8 = (int *)0x0;
  p_Var3 = (cp->super_Proxy).incoming_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(cp->super_Proxy).incoming_._M_t._M_impl.super__Rb_tree_header;
  local_b8 = master;
  if ((_Rb_tree_header *)p_Var3 != p_Var1) {
    do {
      if (iStack_d0._M_current == local_c8) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&local_d8,iStack_d0,(int *)(p_Var3 + 1));
      }
      else {
        *iStack_d0._M_current = p_Var3[1]._M_color;
        iStack_d0._M_current = iStack_d0._M_current + 1;
      }
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var1);
    if (iStack_d0._M_current != local_d8) {
      this = &(cp->super_Proxy).incoming_;
      local_a8 = &(local_b8->blocks_).create_;
      local_b0 = &(local_b8->blocks_).load_;
      uVar5 = 0;
      do {
        iVar2 = local_d8[uVar5];
        local_78[0] = (undefined **)CONCAT44(local_78[0]._4_4_,iVar2);
        pmVar4 = std::
                 map<int,_diy::MemoryBuffer,_std::less<int>,_std::allocator<std::pair<const_int,_diy::MemoryBuffer>_>_>
                 ::operator[](this,(key_type *)((_Any_data *)local_78)->_M_pod_data);
        if ((pmVar4->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            (pmVar4->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start) {
          local_78[0] = (undefined **)CONCAT44(local_78[0]._4_4_,iVar2);
          pmVar4 = std::
                   map<int,_diy::MemoryBuffer,_std::less<int>,_std::allocator<std::pair<const_int,_diy::MemoryBuffer>_>_>
                   ::operator[](this,(key_type *)((_Any_data *)local_78)->_M_pod_data);
          (*(pmVar4->super_BinaryBuffer)._vptr_BinaryBuffer[4])(pmVar4,&local_bc,4);
          std::function<void_*()>::function((function<void_*()> *)local_78,local_a8);
          if ((code *)VStack_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start == (code *)0x0) {
            std::__throw_bad_function_call();
          }
          b = (*(code *)VStack_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_finish)((_Any_data *)local_78);
          if ((code *)VStack_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start != (code *)0x0) {
            (*(code *)VStack_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start)
                      ((_Any_data *)local_78,(_Any_data *)local_78,__destroy_functor);
          }
          local_78[0] = &PTR__MemoryBuffer_0014a528;
          vStack_48.super__Vector_base<diy::BinaryBlob,_std::allocator<diy::BinaryBlob>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          vStack_48.super__Vector_base<diy::BinaryBlob,_std::allocator<diy::BinaryBlob>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_50 = 0;
          vStack_48.super__Vector_base<diy::BinaryBlob,_std::allocator<diy::BinaryBlob>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          VStack_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          VStack_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          local_78[1] = (undefined **)0x0;
          VStack_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          local_a0._0_4_ = iVar2;
          pmVar4 = std::
                   map<int,_diy::MemoryBuffer,_std::less<int>,_std::allocator<std::pair<const_int,_diy::MemoryBuffer>_>_>
                   ::operator[](this,(key_type *)local_a0._M_pod_data);
          Serialization<std::vector<char,_std::allocator<char>_>_>::load
                    (&pmVar4->super_BinaryBuffer,&VStack_68);
          std::function<void_(void_*,_diy::BinaryBuffer_&)>::function
                    ((function<void_(void_*,_diy::BinaryBuffer_&)> *)&local_a0,local_b0);
          local_80 = b;
          if (local_90 == (code *)0x0) {
            std::__throw_bad_function_call();
          }
          (*local_88)(&local_a0,&local_80,(BinaryBuffer *)local_78);
          if (local_90 != (code *)0x0) {
            (*local_90)(&local_a0,&local_a0,__destroy_functor);
          }
          local_a0._0_4_ = iVar2;
          pmVar4 = std::
                   map<int,_diy::MemoryBuffer,_std::less<int>,_std::allocator<std::pair<const_int,_diy::MemoryBuffer>_>_>
                   ::operator[](this,(key_type *)local_a0._M_pod_data);
          Serialization<std::vector<char,_std::allocator<char>_>_>::load
                    (&pmVar4->super_BinaryBuffer,&VStack_68);
          l = LinkFactory::load((BinaryBuffer *)local_78);
          Master::add(local_b8,local_bc,b,l);
          local_78[0] = &PTR__MemoryBuffer_0014a528;
          std::vector<diy::BinaryBlob,_std::allocator<diy::BinaryBlob>_>::~vector(&vStack_48);
          if ((code *)VStack_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start != (code *)0x0) {
            operator_delete(VStack_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)VStack_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)VStack_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 < (ulong)((long)iStack_d0._M_current - (long)local_d8 >> 2));
    }
    if (local_d8 != (int *)0x0) {
      operator_delete(local_d8,(long)local_c8 - (long)local_d8);
    }
  }
  return;
}

Assistant:

inline void recv_block(AuxBlock*,                                      // local block (unused)
                const diy::Master::ProxyWithLink&   cp,         // communication proxy for neighbor blocks
                diy::Master&                        master)     // real master with multiple blocks per process
{
    std::vector<int> incoming_gids;
    cp.incoming(incoming_gids);

    // for anything incoming, dequeue data received in the last exchange
    for (int i = 0; i < incoming_gids.size(); i++)
    {
        int gid = incoming_gids[i];
        if (cp.incoming(gid).size())
        {
            // dequeue the gid of the moving block
            int move_gid;
            cp.dequeue(gid, move_gid);

            // dequeue the block
            void* recv_b = master.creator()();
            diy::MemoryBuffer bb;
            cp.dequeue(gid, bb.buffer);
            master.loader()(recv_b, bb);

            // dequeue the link
            diy::Link* recv_link;
            cp.dequeue(gid, bb.buffer);
            recv_link = diy::LinkFactory::load(bb);

            // add block to the master
            master.add(move_gid, recv_b, recv_link);
        }
    }
}